

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupWithConstraints(Gia_Man_t *p,Vec_Int_t *vPoTypes)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  p->pObjs->Value = 0;
  for (iVar6 = 0; iVar6 < p->vCis->nSize; iVar6 = iVar6 + 1) {
    pGVar5 = Gia_ManCi(p,iVar6);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar5->Value = uVar1;
  }
  for (iVar6 = 0; iVar6 < p->nObjs; iVar6 = iVar6 + 1) {
    pGVar5 = Gia_ManObj(p,iVar6);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      iVar3 = Gia_ObjFanin1Copy(pGVar5);
      uVar1 = Gia_ManAppendAnd(p_00,iVar2,iVar3);
      pGVar5->Value = uVar1;
    }
  }
  for (iVar6 = 0; iVar6 < p->vCos->nSize - p->nRegs; iVar6 = iVar6 + 1) {
    pGVar5 = Gia_ManCo(p,iVar6);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = Vec_IntEntry(vPoTypes,iVar6);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      uVar1 = Gia_ManAppendCo(p_00,iVar2);
      pGVar5->Value = uVar1;
    }
  }
  iVar2 = 0;
  for (iVar6 = 0; iVar6 < p->vCos->nSize - p->nRegs; iVar6 = iVar6 + 1) {
    pGVar5 = Gia_ManCo(p,iVar6);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar3 = Vec_IntEntry(vPoTypes,iVar6);
    if (iVar3 == 1) {
      uVar1 = Gia_ObjFanin0Copy(pGVar5);
      uVar1 = Gia_ManAppendCo(p_00,uVar1 ^ 1);
      pGVar5->Value = uVar1;
      iVar2 = iVar2 + 1;
    }
  }
  iVar6 = 0;
  do {
    iVar3 = p->nRegs;
    if (iVar3 <= iVar6) {
LAB_001dd7c4:
      Gia_ManSetRegNum(p_00,iVar3);
      p_00->nConstrs = iVar2;
      iVar6 = Gia_ManIsNormalized(p_00);
      if (iVar6 != 0) {
        return p_00;
      }
      __assert_fail("Gia_ManIsNormalized(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                    ,0xd40,"Gia_Man_t *Gia_ManDupWithConstraints(Gia_Man_t *, Vec_Int_t *)");
    }
    pGVar5 = Gia_ManCo(p,(p->vCos->nSize - iVar3) + iVar6);
    if (pGVar5 == (Gia_Obj_t *)0x0) {
      iVar3 = p->nRegs;
      goto LAB_001dd7c4;
    }
    iVar3 = Gia_ObjFanin0Copy(pGVar5);
    uVar1 = Gia_ManAppendCo(p_00,iVar3);
    pGVar5->Value = uVar1;
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupWithConstraints( Gia_Man_t * p, Vec_Int_t * vPoTypes )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nConstr = 0;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vPoTypes, i) == 0 ) // regular PO
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vPoTypes, i) == 1 ) // constraint (should be complemented!)
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) ^ 1 ), nConstr++;
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
//    Gia_ManDupRemapEquiv( pNew, p );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = nConstr;
    assert( Gia_ManIsNormalized(pNew) );
    return pNew;
}